

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

TypeID NULLCTypeInfo::TypeSubType(int *typeID)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternTypeInfo *type;
  int *typeID_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if ((pEVar1->subCat == CAT_ARRAY) || (pEVar1->subCat == CAT_POINTER)) {
      typeID_local._4_4_ = getTypeID((pEVar1->field_11).subType);
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("typeid::subType received type (%s) that neither pointer nor array",pcVar2);
      typeID_local._4_4_ = getTypeID(0);
    }
    return (TypeID)typeID_local._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,199,"TypeID NULLCTypeInfo::TypeSubType(int *)");
}

Assistant:

TypeID TypeSubType(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_ARRAY && type.subCat != ExternTypeInfo::CAT_POINTER)
		{
			nullcThrowError("typeid::subType received type (%s) that neither pointer nor array", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		return getTypeID(type.subType);
	}